

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O3

void SetImplicitArgs(TArray<PType_*,_PType_*> *args,TArray<unsigned_int,_unsigned_int> *argflags,
                    TArray<FName,_FName> *argnames,PStruct *cls,DWORD funcflags,int useflags)

{
  uint uVar1;
  PPointer *pPVar2;
  PStruct *type;
  FName local_3c;
  PPointer *local_38;
  
  if ((args != (TArray<PType_*,_PType_*> *)0x0) && (args->Count != 0)) {
    __assert_fail("args == nullptr || args->Size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef.cpp"
                  ,0x6e,
                  "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, TArray<FName> *, PStruct *, DWORD, int)"
                 );
  }
  if ((argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) && (argflags->Count != 0)) {
    __assert_fail("argflags == nullptr || argflags->Size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef.cpp"
                  ,0x6f,
                  "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, TArray<FName> *, PStruct *, DWORD, int)"
                 );
  }
  if ((funcflags & 2) != 0) {
    if (args != (TArray<PType_*,_PType_*> *)0x0) {
      pPVar2 = NewPointer((PType *)cls,false);
      TArray<PType_*,_PType_*>::Grow(args,1);
      uVar1 = args->Count;
      args->Array[uVar1] = (PType *)pPVar2;
      args->Count = uVar1 + 1;
    }
    if (argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) {
      TArray<unsigned_int,_unsigned_int>::Grow(argflags,1);
      argflags->Array[argflags->Count] = 0x1010;
      argflags->Count = argflags->Count + 1;
    }
    if (argnames != (TArray<FName,_FName> *)0x0) {
      TArray<FName,_FName>::Grow(argnames,1);
      uVar1 = argnames->Count;
      argnames->Array[uVar1].Index = 0x271;
      argnames->Count = uVar1 + 1;
    }
  }
  if ((funcflags & 4) != 0) {
    if (args != (TArray<PType_*,_PType_*> *)0x0) {
      if ((useflags & 0xcU) == 0) {
        pPVar2 = NewPointer((PType *)cls,false);
        TArray<PType_*,_PType_*>::Grow(args,1);
        uVar1 = args->Count;
        args->Array[uVar1] = (PType *)pPVar2;
        args->Count = uVar1 + 1;
      }
      else {
        local_38 = NewPointer((PType *)AActor::RegistrationInfo.MyClass,false);
        TArray<PType_*,_PType_*>::Insert(args,0,(PType **)&local_38);
      }
      local_3c.Index = FName::NameManager::FindName(&FName::NameData,"FStateParamInfo",false);
      type = NewStruct(&local_3c,(PTypeBase *)0x0);
      pPVar2 = NewPointer((PType *)type,false);
      TArray<PType_*,_PType_*>::Grow(args,1);
      uVar1 = args->Count;
      args->Array[uVar1] = (PType *)pPVar2;
      args->Count = uVar1 + 1;
    }
    if (argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) {
      TArray<unsigned_int,_unsigned_int>::Grow(argflags,1);
      argflags->Array[argflags->Count] = 0x1010;
      argflags->Count = argflags->Count + 1;
      TArray<unsigned_int,_unsigned_int>::Grow(argflags,1);
      argflags->Array[argflags->Count] = 0x1010;
      argflags->Count = argflags->Count + 1;
    }
    if (argnames != (TArray<FName,_FName> *)0x0) {
      TArray<FName,_FName>::Grow(argnames,1);
      uVar1 = argnames->Count;
      argnames->Array[uVar1].Index = 0x272;
      argnames->Count = uVar1 + 1;
      TArray<FName,_FName>::Grow(argnames,1);
      uVar1 = argnames->Count;
      argnames->Array[uVar1].Index = 0x273;
      argnames->Count = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void SetImplicitArgs(TArray<PType *> *args, TArray<DWORD> *argflags, TArray<FName> *argnames, PStruct *cls, DWORD funcflags, int useflags)
{
	// Must be called before adding any other arguments.
	assert(args == nullptr || args->Size() == 0);
	assert(argflags == nullptr || argflags->Size() == 0);

	if (funcflags & VARF_Method)
	{
		// implied self pointer
		if (args != nullptr)		args->Push(NewPointer(cls)); 
		if (argflags != nullptr)	argflags->Push(VARF_Implicit | VARF_ReadOnly);
		if (argnames != nullptr)	argnames->Push(NAME_self);
	}
	if (funcflags & VARF_Action)
	{
		// implied caller and callingstate pointers
		if (args != nullptr)
		{
			// Special treatment for weapons and CustomInventory flagged functions: 'self' is not the defining class but the actual user of the item, so this pointer must be of type 'Actor'
			if (useflags & (SUF_WEAPON|SUF_ITEM))
			{
				args->Insert(0, NewPointer(RUNTIME_CLASS(AActor)));	// this must go in before the real pointer to the containing class.
			}
			else
			{
				args->Push(NewPointer(cls));
			}
			args->Push(NewPointer(NewStruct("FStateParamInfo", nullptr)));
		}
		if (argflags != nullptr)
		{
			argflags->Push(VARF_Implicit | VARF_ReadOnly);
			argflags->Push(VARF_Implicit | VARF_ReadOnly);
		}
		if (argnames != nullptr)
		{
			argnames->Push(NAME_invoker);
			argnames->Push(NAME_stateinfo);
		}
	}
}